

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O3

exr_result_t
uncompress_b44_impl(exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
                   void *uncompressed_data,uint64_t uncomp_buf_size)

{
  byte bVar1;
  exr_coding_channel_info_t *peVar2;
  byte bVar3;
  ushort uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  void *__dest;
  void *pvVar13;
  ushort *__src;
  uint uVar14;
  long lVar15;
  void *pvVar16;
  exr_coding_channel_info_t *peVar17;
  int x;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar22 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  undefined1 auVar44 [16];
  int iVar45;
  int iVar46;
  uint16_t s [16];
  ushort local_108 [20];
  ulong local_e0;
  void *local_d8;
  long local_d0;
  void *local_c8;
  exr_decode_pipeline_t *local_c0;
  void *local_b8;
  long local_b0;
  void *local_a8;
  size_t local_a0;
  long local_98;
  void *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  uint64_t local_70;
  exr_coding_channel_info_t *local_68;
  ulong local_60;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  uVar18 = (ulong)(ushort)decode->channel_count;
  local_e0 = comp_buf_size;
  local_c0 = decode;
  local_b8 = uncompressed_data;
  local_70 = uncomp_buf_size;
  if (0 < decode->channel_count) {
    pvVar16 = decode->scratch_buffer_1;
    lVar12 = 0;
    iVar20 = -0x7ffffff1;
    iVar23 = -0x80000000;
    iVar24 = -0x7ffffff1;
    iVar26 = -0x80000000;
    pvVar13 = (void *)0x0;
    local_48 = -0x7ffffff1;
    iStack_44 = -0x7ffffff1;
    iStack_40 = -0x7ffffff1;
    iStack_3c = -0x7ffffff1;
    local_58 = -0x80000000;
    iStack_54 = -0x80000000;
    iStack_50 = -0x80000000;
    iStack_4c = -0x80000000;
    auVar40 = _DAT_0012a090;
    auVar41 = _DAT_0012a0a0;
    auVar32 = _DAT_0012a0b0;
    auVar42 = _DAT_0012a0c0;
    auVar44 = _DAT_0012a0e0;
    iVar8 = iVar20;
    iVar43 = iVar24;
    iVar45 = iVar23;
    iVar46 = iVar26;
    do {
      peVar2 = decode->channels;
      lVar15 = (long)peVar2[lVar12].width;
      local_d0 = (long)peVar2[lVar12].height;
      sVar11 = (long)peVar2[lVar12].bytes_per_element * local_d0 * lVar15;
      if (sVar11 != 0) {
        peVar17 = peVar2 + lVar12;
        if (peVar17->data_type == 1) {
          if (0 < peVar2[lVar12].height) {
            uVar18 = 0;
            local_b0 = lVar15;
            local_a0 = sVar11;
            local_98 = lVar12;
            local_90 = pvVar16;
            local_68 = peVar17;
            do {
              local_88 = uVar18;
              if (0 < (int)lVar15) {
                pvVar16 = (void *)((long)local_90 + uVar18 * lVar15 * 2);
                local_d8 = (void *)((long)pvVar16 + lVar15 * 2);
                __dest = (void *)((long)local_d8 + lVar15 * 2);
                local_a8 = (void *)((long)__dest + lVar15 * 2);
                local_60 = uVar18 | 3;
                local_78 = uVar18 | 1;
                local_80 = uVar18 | 2;
                uVar18 = 0;
                local_c8 = pvVar13;
                do {
                  if (local_e0 < (long)local_c8 + 3U) {
                    return 1;
                  }
                  bVar1 = (byte)*(ushort *)((long)compressed_data + 2);
                  if (bVar1 < 0x34) {
                    local_c8 = (void *)((long)local_c8 + 0xe);
                    if (local_e0 < local_c8) {
                      return 1;
                    }
                    local_108[0] = *compressed_data << 8 | *compressed_data >> 8;
                    bVar3 = bVar1 >> 2;
                    sVar7 = (short)(-0x20 << (bVar3 & 0x1f));
                    sVar6 = local_108[0] + sVar7;
                    local_108[4] = (short)(((bVar1 & 3) << 4 |
                                           (uint)(*(byte *)((long)compressed_data + 3) >> 4)) <<
                                          (bVar3 & 0x1f)) + sVar6;
                    iVar8 = (uint)(byte)((byte)*(ushort *)((long)compressed_data + 4) >> 6) +
                            (*(byte *)((long)compressed_data + 3) & 0xf) * 4;
                    sVar5 = local_108[4] + sVar7;
                    local_108[8] = (short)(iVar8 << (bVar3 & 0x1f)) + sVar5;
                    local_108[0xc] =
                         (short)(((byte)*(ushort *)((long)compressed_data + 4) & 0x3f) + iVar8 +
                                 -0x20 << (bVar3 & 0x1f)) + sVar5;
                    local_108[1] = ((ushort)(*(byte *)((long)compressed_data + 5) >> 2) <<
                                   (bVar3 & 0x1f)) + sVar6;
                    local_108[5] = (short)(((*(byte *)((long)compressed_data + 5) & 3) << 4 |
                                           (uint)(byte)((byte)*(ushort *)((long)compressed_data + 6)
                                                       >> 4)) << (bVar3 & 0x1f)) + sVar5;
                    local_108[9] = (short)((uint)(*(byte *)((long)compressed_data + 7) >> 6) +
                                           ((byte)*(ushort *)((long)compressed_data + 6) & 0xf) * 4
                                          << (bVar3 & 0x1f)) + sVar7 + local_108[8];
                    local_108[0xd] =
                         (short)((*(byte *)((long)compressed_data + 7) & 0x3f) << (bVar3 & 0x1f)) +
                         sVar7 + local_108[0xc];
                    local_108[2] = ((ushort)(byte)((byte)*(ushort *)((long)compressed_data + 8) >> 2
                                                  ) << (bVar3 & 0x1f)) + sVar7 + local_108[1];
                    local_108[6] = (short)((((byte)*(ushort *)((long)compressed_data + 8) & 3) << 4
                                           | (uint)(*(byte *)((long)compressed_data + 9) >> 4)) <<
                                          (bVar3 & 0x1f)) + sVar7 + local_108[5];
                    local_108[10] =
                         (short)((uint)(byte)((byte)*(ushort *)((long)compressed_data + 10) >> 6) +
                                 (*(byte *)((long)compressed_data + 9) & 0xf) * 4 << (bVar3 & 0x1f))
                         + sVar7 + local_108[9];
                    local_108[0xe] =
                         (short)(((byte)*(ushort *)((long)compressed_data + 10) & 0x3f) <<
                                (bVar3 & 0x1f)) + sVar7 + local_108[0xd];
                    local_108[3] = ((ushort)(*(byte *)((long)compressed_data + 0xb) >> 2) <<
                                   (bVar3 & 0x1f)) + sVar7 + local_108[2];
                    local_108[7] = (short)(((*(byte *)((long)compressed_data + 0xb) & 3) << 4 |
                                           (uint)(byte)((byte)*(ushort *)
                                                               ((long)compressed_data + 0xc) >> 4))
                                          << (bVar3 & 0x1f)) + sVar7 + local_108[6];
                    local_108[0xb] =
                         (short)((uint)(*(byte *)((long)compressed_data + 0xd) >> 6) +
                                 ((byte)*(ushort *)((long)compressed_data + 0xc) & 0xf) * 4 <<
                                (bVar3 & 0x1f)) + sVar7 + local_108[10];
                    local_108[0xf] =
                         (short)((*(byte *)((long)compressed_data + 0xd) & 0x3f) << (bVar3 & 0x1f))
                         + sVar7 + local_108[0xe];
                    lVar12 = 0;
                    auVar40._8_4_ = 0xffffffff;
                    auVar40._0_8_ = 0xffffffffffffffff;
                    auVar40._12_4_ = 0xffffffff;
                    do {
                      auVar41 = *(undefined1 (*) [16])(local_108 + lVar12);
                      auVar32._0_2_ = -(ushort)(auVar41._0_2_ < 0);
                      auVar32._2_2_ = -(ushort)(auVar41._2_2_ < 0);
                      auVar32._4_2_ = -(ushort)(auVar41._4_2_ < 0);
                      auVar32._6_2_ = -(ushort)(auVar41._6_2_ < 0);
                      auVar32._8_2_ = -(ushort)(auVar41._8_2_ < 0);
                      auVar32._10_2_ = -(ushort)(auVar41._10_2_ < 0);
                      auVar32._12_2_ = -(ushort)(auVar41._12_2_ < 0);
                      auVar32._14_2_ = -(ushort)(auVar41._14_2_ < 0);
                      *(undefined1 (*) [16])(local_108 + lVar12) =
                           (auVar32 | auVar41) ^ auVar40 | auVar41 & auVar32 & _DAT_0012a080;
                      lVar12 = lVar12 + 8;
                    } while (lVar12 != 0x10);
                    lVar12 = 0xe;
                    lVar15 = local_b0;
                  }
                  else {
                    uVar4 = (ushort)(byte)*compressed_data << 8;
                    local_108[0] = uVar4 & 0x7fff | (ushort)*(byte *)((long)compressed_data + 1);
                    if (-1 < (short)uVar4) {
                      local_108[0] = ~CONCAT11((byte)*compressed_data,
                                               *(byte *)((long)compressed_data + 1));
                    }
                    lVar12 = 0;
                    do {
                      auVar22._8_4_ = (int)lVar12;
                      auVar22._0_8_ = lVar12;
                      auVar22._12_4_ = (int)((ulong)lVar12 >> 0x20);
                      auVar27 = (auVar22 | auVar42) ^ auVar44;
                      iVar21 = auVar27._0_4_;
                      iVar25 = auVar27._8_4_;
                      auVar33._4_4_ = iVar21;
                      auVar33._0_4_ = iVar21;
                      auVar33._8_4_ = iVar25;
                      auVar33._12_4_ = iVar25;
                      auVar37._0_4_ = -(uint)(iVar21 < iVar20);
                      auVar37._4_4_ = -(uint)(iVar21 < iVar8);
                      auVar37._8_4_ = -(uint)(iVar25 < iVar24);
                      auVar37._12_4_ = -(uint)(iVar25 < iVar43);
                      auVar28._0_4_ = -(uint)(auVar27._4_4_ == iVar23);
                      auVar28._4_4_ = -(uint)(auVar27._4_4_ == iVar45);
                      auVar28._8_4_ = -(uint)(auVar27._12_4_ == iVar26);
                      auVar28._12_4_ = -(uint)(auVar27._12_4_ == iVar46);
                      auVar28 = auVar28 & auVar37;
                      auVar27 = pshuflw(auVar33,auVar28,0xe8);
                      auVar27 = packssdw(auVar27,auVar27);
                      if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        local_108[lVar12 + 1] = local_108[0];
                      }
                      auVar27 = packssdw(auVar28,auVar28);
                      auVar27 = packssdw(auVar27,auVar27);
                      if ((auVar27._0_4_ >> 0x10 & 1) != 0) {
                        local_108[lVar12 + 2] = local_108[0];
                      }
                      auVar27 = (auVar22 | auVar32) ^ auVar44;
                      iVar21 = auVar27._0_4_;
                      iVar25 = auVar27._8_4_;
                      auVar34._4_4_ = iVar21;
                      auVar34._0_4_ = iVar21;
                      auVar34._8_4_ = iVar25;
                      auVar34._12_4_ = iVar25;
                      auVar38._0_4_ = -(uint)(iVar21 < iVar20);
                      auVar38._4_4_ = -(uint)(iVar21 < iVar8);
                      auVar38._8_4_ = -(uint)(iVar25 < iVar24);
                      auVar38._12_4_ = -(uint)(iVar25 < iVar43);
                      auVar29._0_4_ = -(uint)(auVar27._4_4_ == iVar23);
                      auVar29._4_4_ = -(uint)(auVar27._4_4_ == iVar45);
                      auVar29._8_4_ = -(uint)(auVar27._12_4_ == iVar26);
                      auVar29._12_4_ = -(uint)(auVar27._12_4_ == iVar46);
                      auVar29 = auVar29 & auVar38;
                      auVar27 = packssdw(auVar34,auVar29);
                      auVar27 = packssdw(auVar27,auVar27);
                      if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        local_108[lVar12 + 3] = local_108[0];
                      }
                      auVar27 = pshufhw(auVar29,auVar29,0x84);
                      auVar27 = packssdw(auVar27,auVar27);
                      if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        local_108[lVar12 + 4] = local_108[0];
                      }
                      auVar27 = (auVar22 | auVar41) ^ auVar44;
                      iVar21 = auVar27._0_4_;
                      iVar25 = auVar27._8_4_;
                      auVar35._4_4_ = iVar21;
                      auVar35._0_4_ = iVar21;
                      auVar35._8_4_ = iVar25;
                      auVar35._12_4_ = iVar25;
                      auVar39._0_4_ = -(uint)(iVar21 < iVar20);
                      auVar39._4_4_ = -(uint)(iVar21 < iVar8);
                      auVar39._8_4_ = -(uint)(iVar25 < iVar24);
                      auVar39._12_4_ = -(uint)(iVar25 < iVar43);
                      auVar30._0_4_ = -(uint)(auVar27._4_4_ == iVar23);
                      auVar30._4_4_ = -(uint)(auVar27._4_4_ == iVar45);
                      auVar30._8_4_ = -(uint)(auVar27._12_4_ == iVar26);
                      auVar30._12_4_ = -(uint)(auVar27._12_4_ == iVar46);
                      auVar30 = auVar30 & auVar39;
                      auVar27 = pshuflw(auVar35,auVar30,0xe8);
                      auVar27 = packssdw(auVar27,auVar27);
                      if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        local_108[lVar12 + 5] = local_108[0];
                      }
                      auVar27 = packssdw(auVar30,auVar30);
                      auVar27 = packssdw(auVar27,auVar27);
                      if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        local_108[lVar12 + 6] = local_108[0];
                      }
                      auVar22 = (auVar22 | auVar40) ^ auVar44;
                      iVar21 = auVar22._0_4_;
                      iVar25 = auVar22._8_4_;
                      auVar31._4_4_ = iVar21;
                      auVar31._0_4_ = iVar21;
                      auVar31._8_4_ = iVar25;
                      auVar31._12_4_ = iVar25;
                      auVar36._0_4_ = -(uint)(iVar21 < iVar20);
                      auVar36._4_4_ = -(uint)(iVar21 < iVar8);
                      auVar36._8_4_ = -(uint)(iVar25 < iVar24);
                      auVar36._12_4_ = -(uint)(iVar25 < iVar43);
                      auVar27._0_4_ = -(uint)(auVar22._4_4_ == iVar23);
                      auVar27._4_4_ = -(uint)(auVar22._4_4_ == iVar45);
                      auVar27._8_4_ = -(uint)(auVar22._12_4_ == iVar26);
                      auVar27._12_4_ = -(uint)(auVar22._12_4_ == iVar46);
                      auVar27 = auVar27 & auVar36;
                      auVar22 = packssdw(auVar31,auVar27);
                      auVar22 = packssdw(auVar22,auVar22);
                      if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        local_108[lVar12 + 7] = local_108[0];
                      }
                      auVar22 = pshufhw(auVar27,auVar27,0x84);
                      auVar22 = packssdw(auVar22,auVar22);
                      if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        local_108[lVar12 + 8] = local_108[0];
                      }
                      lVar12 = lVar12 + 8;
                    } while (lVar12 != 0x10);
                    lVar12 = 3;
                    local_c8 = (void *)((long)local_c8 + 3U);
                  }
                  if (peVar17->p_linear != '\0') {
                    lVar10 = 0;
                    do {
                      local_108[lVar10] = exrcore_logTable[local_108[lVar10]];
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 0x10);
                  }
                  sVar11 = (lVar15 - uVar18) * 2;
                  if ((long)(uVar18 | 3) < lVar15) {
                    sVar11 = 8;
                  }
                  memcpy(pvVar16,local_108,sVar11);
                  if ((long)local_60 < local_d0) {
                    memcpy(local_d8,local_108 + 4,sVar11);
                    memcpy(__dest,local_108 + 8,sVar11);
                    __src = local_108 + 0xc;
                    pvVar13 = local_a8;
LAB_001060f9:
                    memcpy(pvVar13,__src,sVar11);
                  }
                  else {
                    if ((long)local_78 < local_d0) {
                      memcpy(local_d8,local_108 + 4,sVar11);
                    }
                    if ((long)local_80 < local_d0) {
                      __src = local_108 + 8;
                      pvVar13 = __dest;
                      goto LAB_001060f9;
                    }
                  }
                  compressed_data = (void *)((long)compressed_data + lVar12);
                  pvVar16 = (void *)((long)pvVar16 + 8);
                  local_d8 = (void *)((long)local_d8 + 8);
                  __dest = (void *)((long)__dest + 8);
                  local_a8 = (void *)((long)local_a8 + 8);
                  uVar18 = uVar18 + 4;
                  pvVar13 = local_c8;
                  lVar15 = local_b0;
                  peVar17 = local_68;
                  auVar40 = _DAT_0012a090;
                  auVar41 = _DAT_0012a0a0;
                  auVar32 = _DAT_0012a0b0;
                  auVar42 = _DAT_0012a0c0;
                  auVar44 = _DAT_0012a0e0;
                  iVar20 = local_48;
                  iVar8 = iStack_44;
                  iVar24 = iStack_40;
                  iVar43 = iStack_3c;
                  iVar23 = local_58;
                  iVar45 = iStack_54;
                  iVar26 = iStack_50;
                  iVar46 = iStack_4c;
                } while ((long)uVar18 < local_b0);
              }
              uVar18 = local_88 + 4;
              sVar11 = local_a0;
              pvVar16 = local_90;
              decode = local_c0;
              lVar12 = local_98;
            } while ((long)uVar18 < local_d0);
          }
          pvVar16 = (void *)((long)pvVar16 + sVar11);
        }
        else {
          pvVar13 = (void *)((long)pvVar13 + sVar11);
          if (local_e0 < pvVar13) {
            return 1;
          }
          memcpy(pvVar16,compressed_data,sVar11);
          compressed_data = (void *)((long)compressed_data + sVar11);
          pvVar16 = (void *)((long)pvVar16 + sVar11);
          auVar40 = _DAT_0012a090;
          auVar41 = _DAT_0012a0a0;
          auVar32 = _DAT_0012a0b0;
          auVar42 = _DAT_0012a0c0;
          auVar44 = _DAT_0012a0e0;
          iVar20 = local_48;
          iVar8 = iStack_44;
          iVar24 = iStack_40;
          iVar43 = iStack_3c;
          iVar23 = local_58;
          iVar45 = iStack_54;
          iVar26 = iStack_50;
          iVar46 = iStack_4c;
        }
      }
      lVar12 = lVar12 + 1;
      uVar18 = (ulong)decode->channel_count;
    } while (lVar12 < (long)uVar18);
  }
  iVar8 = (decode->chunk).height;
  if (0 < iVar8) {
    pvVar16 = (void *)0x0;
    uVar19 = 0;
    do {
      if (0 < (short)uVar18) {
        local_e0 = CONCAT44(local_e0._4_4_,(decode->chunk).start_y + (int)pvVar16);
        local_c8 = decode->scratch_buffer_1;
        lVar15 = 0x19;
        lVar12 = 0;
        local_d8 = pvVar16;
        do {
          pvVar13 = local_b8;
          peVar2 = decode->channels;
          sVar11 = (long)*(char *)((long)&peVar2->channel_name + lVar15) *
                   (long)*(int *)((long)peVar2 + lVar15 + -0xd);
          lVar10 = (long)*(int *)((long)peVar2 + lVar15 + -0x11) * sVar11;
          if (lVar10 != 0) {
            uVar14 = *(uint *)((long)peVar2 + lVar15 + -5);
            uVar9 = (uint)pvVar16;
            if (1 < (int)uVar14) {
              if ((int)local_e0 % (int)uVar14 != 0) {
                local_c8 = (void *)((long)local_c8 + lVar10);
                goto LAB_001062e0;
              }
              uVar9 = (uint)(((ulong)pvVar16 & 0xffffffff) / (ulong)uVar14);
            }
            uVar19 = uVar19 + sVar11;
            if (local_70 < uVar19) {
              return 1;
            }
            memcpy(local_b8,(void *)(uVar9 * sVar11 + (long)local_c8),sVar11);
            local_b8 = (void *)((long)pvVar13 + sVar11);
            local_c8 = (void *)((long)local_c8 + lVar10);
            uVar18 = (ulong)(ushort)local_c0->channel_count;
            pvVar16 = local_d8;
            decode = local_c0;
          }
LAB_001062e0:
          lVar12 = lVar12 + 1;
          lVar15 = lVar15 + 0x30;
        } while (lVar12 < (short)uVar18);
        iVar8 = (decode->chunk).height;
      }
      uVar14 = (int)pvVar16 + 1;
      pvVar16 = (void *)(ulong)uVar14;
    } while ((int)uVar14 < iVar8);
  }
  return 0;
}

Assistant:

static exr_result_t
uncompress_b44_impl (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncomp_buf_size)
{
    const uint8_t* in      = (const uint8_t*) compressed_data;
    uint8_t*       out     = (uint8_t*) uncompressed_data;
    uint8_t*       scratch = (uint8_t*) decode->scratch_buffer_1;
    uint8_t*       tmp;
    uint16_t *     row0, *row1, *row2, *row3;
    uint64_t       n, nBytes, bpl = 0, bIn = 0;
    int            nx, ny;
    uint16_t       s[16];

    for (int c = 0; c < decode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* curc = decode->channels + c;
        nx                                    = curc->width;
        ny                                    = curc->height;
        nBytes = (uint64_t) (ny) * (uint64_t) (nx) *
                 (uint64_t) (curc->bytes_per_element);

        if (nBytes == 0) continue;

        if (curc->data_type != EXR_PIXEL_HALF)
        {
            if (bIn + nBytes > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;
            memcpy (scratch, in, nBytes);
            in += nBytes;
            bIn += nBytes;
            scratch += nBytes;
            continue;
        }

        for (int y = 0; y < ny; y += 4)
        {
            row0 = (uint16_t*) scratch;
            row0 += y * nx;
            row1 = row0 + nx;
            row2 = row1 + nx;
            row3 = row2 + nx;
            for (int x = 0; x < nx; x += 4)
            {
                if (bIn + 3 > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;

                /* check if 3-byte encoded flat field */
                if (in[2] >= (13 << 2))
                {
                    unpack3 (in, s);
                    in += 3;
                    bIn += 3;
                }
                else
                {
                    if (bIn + 14 > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;
                    unpack14 (in, s);
                    in += 14;
                    bIn += 14;
                }

                if (curc->p_linear) convertToLinear (s);

                priv_from_native16 (s, 16);

                n = (x + 3 < nx) ? 4 * sizeof (uint16_t)
                                 : (uint64_t) (nx - x) * sizeof (uint16_t);
                if (y + 3 < ny)
                {
                    memcpy (row0, &s[0], n);
                    memcpy (row1, &s[4], n);
                    memcpy (row2, &s[8], n);
                    memcpy (row3, &s[12], n);
                }
                else
                {
                    memcpy (row0, &s[0], n);
                    if (y + 1 < ny) memcpy (row1, &s[4], n);
                    if (y + 2 < ny) memcpy (row2, &s[8], n);
                }
                row0 += 4;
                row1 += 4;
                row2 += 4;
                row3 += 4;
            }
        }
        scratch += nBytes;
    }

    /* now put it back so each scanline has channel data */
    bIn = 0;
    for (int y = 0; y < decode->chunk.height; ++y)
    {
        int cury = y + decode->chunk.start_y;

        scratch = (uint8_t*) decode->scratch_buffer_1;
        for (int c = 0; c < decode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = decode->channels + c;

            nx     = curc->width;
            ny     = curc->height;
            bpl    = ((uint64_t) (nx)) * (uint64_t) (curc->bytes_per_element);
            nBytes = ((uint64_t) (ny)) * bpl;

            if (nBytes == 0) continue;

            tmp = scratch;
            if (curc->y_samples > 1)
            {
                if ((cury % curc->y_samples) != 0)
                {
                    scratch += nBytes;
                    continue;
                }
                tmp += ((uint64_t) (y / curc->y_samples)) * bpl;
            }
            else
                tmp += ((uint64_t) y) * bpl;

            if (bIn + bpl > uncomp_buf_size) return EXR_ERR_OUT_OF_MEMORY;

            memcpy (out, tmp, bpl);

            bIn += bpl;
            out += bpl;
            scratch += nBytes;
        }
    }

    return EXR_ERR_SUCCESS;
}